

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc_global.h
# Opt level: O0

abctime Abc_Clock(void)

{
  int iVar1;
  abctime res;
  timespec ts;
  
  iVar1 = clock_gettime(3,(timespec *)&res);
  if (iVar1 < 0) {
    ts.tv_nsec = -1;
  }
  else {
    ts.tv_nsec = (ts.tv_sec * 1000000) / 1000000000 + res * 1000000;
  }
  return ts.tv_nsec;
}

Assistant:

static inline abctime Abc_Clock()
{
#if (defined(LIN) || defined(LIN64)) && !(__APPLE__ & __MACH__) && !defined(__MINGW32__)
    struct timespec ts;
    if ( clock_gettime(CLOCK_THREAD_CPUTIME_ID, &ts) < 0 ) 
        return (abctime)-1;
    abctime res = ((abctime) ts.tv_sec) * CLOCKS_PER_SEC;
    res += (((abctime) ts.tv_nsec) * CLOCKS_PER_SEC) / 1000000000;
    return res;
#else
    return (abctime) clock();
#endif
}